

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int ixxx::posix::waitid(idtype_t __idtype,__id_t __id,siginfo_t *__infop,int __options)

{
  int iVar1;
  waitid_error *this;
  int *piVar2;
  int r;
  int options_local;
  siginfo_t *infop_local;
  id_t id_local;
  idtype_t idtype_local;
  
  iVar1 = ::waitid(__idtype,__id,__infop,__options);
  if (iVar1 == -1) {
    this = (waitid_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    waitid_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&waitid_error::typeinfo,waitid_error::~waitid_error);
  }
  return iVar1;
}

Assistant:

void waitid(idtype_t idtype, id_t id, siginfo_t *infop, int options)
    {
      int r = ::waitid(idtype, id, infop, options);
      if (r == -1)
        throw waitid_error(errno);
    }